

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O0

Function __thiscall
mp::BasicExprFactory<std::allocator<char>_>::DefineFunction
          (BasicExprFactory<std::allocator<char>_> *this,int index,StringRef name,int num_args,
          Type type)

{
  StringRef name_00;
  BasicExprFactory<std::allocator<char>_> *this_00;
  undefined8 uVar1;
  Function FVar2;
  int in_ESI;
  char *in_RDI;
  undefined4 in_R8D;
  int in_R9D;
  Impl **impl;
  undefined8 in_stack_ffffffffffffffa0;
  int index_00;
  Type in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  BasicCStringRef<char> in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd0;
  CStringRef msg;
  
  index_00 = (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  msg.data_ = in_RDI;
  std::vector<const_mp::Function::Impl_*,_std::allocator<const_mp::Function::Impl_*>_>::size
            ((vector<const_mp::Function::Impl_*,_std::allocator<const_mp::Function::Impl_*>_> *)
             (in_RDI + 0x20));
  internal::CheckIndex(index_00,(size_t)in_RDI);
  this_00 = (BasicExprFactory<std::allocator<char>_> *)
            std::vector<const_mp::Function::Impl_*,_std::allocator<const_mp::Function::Impl_*>_>::
            operator[]((vector<const_mp::Function::Impl_*,_std::allocator<const_mp::Function::Impl_*>_>
                        *)(in_RDI + 0x20),(long)in_ESI);
  if (this_00->_vptr_BasicExprFactory != (_func_int **)0x0) {
    uVar1 = __cxa_allocate_exception(0x18);
    fmt::BasicCStringRef<char>::BasicCStringRef
              ((BasicCStringRef<char> *)&stack0xffffffffffffffc0,"function {} is already defined");
    Error::Error((Error *)CONCAT44(in_ESI,in_R8D),msg,in_R9D);
    __cxa_throw(uVar1,&Error::typeinfo,Error::~Error);
  }
  name_00.data_._4_4_ = in_R9D;
  name_00.data_._0_4_ = in_stack_ffffffffffffffd0;
  name_00.size_._0_4_ = in_R8D;
  name_00.size_._4_4_ = in_ESI;
  FVar2 = CreateFunction(this_00,(Impl **)in_stack_ffffffffffffffc0.data_,name_00,
                         in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
  return (Function)FVar2.impl_;
}

Assistant:

Function DefineFunction(int index, fmt::StringRef name,
                          int num_args, func::Type type) {
    internal::CheckIndex(index, funcs_.size());
    const Function::Impl *&impl = funcs_[index];
    if (impl)
      throw Error("function {} is already defined", index);
    return CreateFunction(impl, name, num_args, type);
  }